

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O3

void duckdb::StringSplitFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  Vector *pVVar2;
  bool bVar3;
  reference pvVar4;
  Vector *vector;
  ulong uVar5;
  idx_t iVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  long lVar9;
  ulong uVar10;
  idx_t *piVar11;
  data_ptr_t pdVar12;
  idx_t size;
  idx_t idx_in_entry;
  ulong uVar13;
  string_t input;
  string_t delim;
  StringSplitInput split_input;
  UnifiedVectorFormat delim_data;
  UnifiedVectorFormat input_data;
  Vector *in_stack_fffffffffffffef8;
  Vector *pVVar14;
  Vector *pVStack_100;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::ToUnifiedFormat(pvVar4,args->count,&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  Vector::ToUnifiedFormat(pvVar4,args->count,&local_c0);
  Vector::SetVectorType(result,FLAT_VECTOR);
  ListVector::SetListSize(result,0);
  pdVar12 = result->data;
  vector = ListVector::GetEntry(result);
  FlatVector::VerifyFlatVector(result);
  if (args->count == 0) {
    size = 0;
  }
  else {
    piVar11 = (idx_t *)(pdVar12 + 8);
    size = 0;
    uVar13 = 0;
    do {
      pVVar2 = pVStack_100;
      uVar5 = uVar13;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)(local_78.sel)->sel_vector[uVar13];
      }
      uVar10 = uVar13;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)(local_c0.sel)->sel_vector[uVar13];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >>
           (uVar5 & 0x3f) & 1) != 0)) {
        pVVar14 = result;
        if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar10 >> 6]
             >> (uVar10 & 0x3f) & 1) != 0)) {
          input.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + uVar10 * 0x10);
          input.value._0_8_ = *(undefined8 *)(local_78.data + uVar5 * 0x10 + 8);
          delim.value.pointer.ptr = &stack0xfffffffffffffef8;
          delim.value._0_8_ = *(undefined8 *)(local_c0.data + uVar10 * 0x10 + 8);
          iVar6 = StringSplitter::Split<duckdb::RegularStringSplit>
                            (*(StringSplitter **)(local_78.data + uVar5 * 0x10),input,delim,
                             (StringSplitInput *)0x0,result);
        }
        else {
          lVar9 = uVar5 * 0x10;
          if ((ulong)*(uint *)(local_78.data + lVar9) < 0xd) {
            pdVar12 = local_78.data + lVar9 + 4;
          }
          else {
            pdVar12 = *(data_ptr_t *)(local_78.data + lVar9 + 8);
          }
          iVar6 = 1;
          StringSplitInput::AddSplit
                    ((StringSplitInput *)&stack0xfffffffffffffef8,(char *)pdVar12,
                     (ulong)*(uint *)(local_78.data + lVar9),0);
        }
        *piVar11 = iVar6;
        piVar11[-1] = size;
        size = size + iVar6;
        pVStack_100 = vector;
      }
      else {
        _Var8._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pVVar14 = in_stack_fffffffffffffef8;
        if (_Var8._M_head_impl == (unsigned_long *)0x0) {
          local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&stack0xfffffffffffffef8,&local_c8);
          pVVar14 = (Vector *)0x0;
          pVStack_100 = (Vector *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)in_stack_fffffffffffffef8;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVVar2;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          _Var8._M_head_impl =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var8._M_head_impl;
        }
        bVar1 = (byte)uVar13 & 0x3f;
        _Var8._M_head_impl[uVar13 >> 6] =
             _Var8._M_head_impl[uVar13 >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      }
      uVar13 = uVar13 + 1;
      piVar11 = piVar11 + 2;
      in_stack_fffffffffffffef8 = pVVar14;
    } while (uVar13 < args->count);
  }
  ListVector::SetListSize(result,size);
  bVar3 = DataChunk::AllConstant(args);
  if (bVar3) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  StringVector::AddHeapReference(vector,pvVar4);
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void StringSplitFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	StringSplitExecutor<RegularStringSplit>(args, state, result, nullptr);
}